

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_move_uint32_iterator_equalorlarger(roaring_uint32_iterator_t *it,uint32_t val)

{
  ushort uVar1;
  roaring_bitmap_t *prVar2;
  uint16_t *puVar3;
  ulong uVar4;
  bitset_container_t *container;
  uint64_t *puVar5;
  _Bool _Var6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  uint8_t uVar10;
  ushort uVar11;
  int32_t candidate;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  
  prVar2 = it->parent;
  iVar8 = (prVar2->high_low_container).size;
  if ((long)iVar8 == 0) {
LAB_00119da1:
    uVar7 = iVar8 - 1;
LAB_00119da3:
    if (-1 < (int)uVar7) {
LAB_00119dad:
      piVar9 = (int *)(prVar2->high_low_container).containers[uVar7];
      uVar10 = (prVar2->high_low_container).typecodes[uVar7];
      if (uVar10 == '\x04') {
        uVar10 = (uint8_t)piVar9[2];
        if (uVar10 == '\x04') {
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        piVar9 = *(int **)piVar9;
      }
      if (uVar10 == '\x03') {
        lVar12 = (long)*piVar9;
        if (lVar12 == 0) goto LAB_00119e79;
        uVar13 = (uint)(ushort)(*(short *)(*(long *)(piVar9 + 2) + -2 + lVar12 * 4) +
                               *(short *)(*(long *)(piVar9 + 2) + -4 + lVar12 * 4));
      }
      else {
        if (uVar10 != '\x02') {
          if (uVar10 != '\x01') {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x18c4,"uint16_t container_maximum(const container_t *, uint8_t)");
          }
          iVar8 = 0xffff;
          uVar14 = 0x400;
LAB_00119df7:
          uVar13 = (int)uVar14 - 1;
          uVar14 = (ulong)uVar13;
          uVar4 = *(ulong *)(*(long *)(piVar9 + 2) + uVar14 * 8);
          if (uVar4 == 0) goto code_r0x00119e06;
          lVar12 = 0x3f;
          if (uVar4 != 0) {
            for (; uVar4 >> lVar12 == 0; lVar12 = lVar12 + -1) {
            }
          }
          uVar13 = iVar8 - ((uint)lVar12 ^ 0x3f);
          goto LAB_00119e8f;
        }
        if ((long)*piVar9 == 0) {
LAB_00119e79:
          uVar13 = 0;
        }
        else {
          uVar13 = (uint)*(ushort *)(*(long *)(piVar9 + 2) + -2 + (long)*piVar9 * 2);
        }
      }
LAB_00119e8f:
      uVar11 = (ushort)val;
      uVar16 = val & 0xffff;
      if ((uVar13 & 0xffff) < uVar16) {
        uVar7 = uVar7 + 1;
        goto LAB_00119e9d;
      }
      it->container_index = uVar7;
      iter_new_container_partial_init(it);
      container = (bitset_container_t *)it->container;
      if (it->typecode == '\x03') {
        puVar5 = container->words;
        iVar8 = container->cardinality;
        if (iVar8 < 1) {
LAB_00119f73:
          uVar7 = 0;
LAB_00119f75:
          uVar13 = 0xffffffff;
          if ((int)uVar7 < iVar8) {
            uVar13 = uVar7;
          }
        }
        else {
          iVar15 = iVar8 + -1;
          uVar7 = 0;
          do {
            uVar13 = iVar15 + uVar7 >> 1;
            uVar1 = *(ushort *)((long)puVar5 + (ulong)uVar13 * 4);
            if (uVar1 < uVar11) {
              uVar7 = uVar13 + 1;
            }
            else {
              if (uVar1 <= uVar11) goto LAB_00119f7f;
              iVar15 = uVar13 - 1;
            }
          } while ((int)uVar7 <= iVar15);
          if (uVar7 == 0) goto LAB_00119f73;
          uVar13 = uVar7 - 1;
          if ((int)(uint)*(ushort *)((long)puVar5 + (ulong)uVar13 * 4 + 2) <
              (int)(uVar16 - *(ushort *)((long)puVar5 + (ulong)uVar13 * 4))) goto LAB_00119f75;
        }
LAB_00119f7f:
        it->run_index = uVar13;
        uVar7 = (uint)*(ushort *)((long)puVar5 + (long)(int)uVar13 * 4);
        if (uVar16 < uVar7) {
          val = uVar7 | it->highbits;
        }
      }
      else {
        if (it->typecode != '\x02') {
          uVar7 = bitset_container_index_equalorlarger(container,uVar11);
          it->in_container_index = uVar7;
          it->current_value = uVar7 | it->highbits;
          goto LAB_00119fb1;
        }
        puVar5 = container->words;
        iVar8 = container->cardinality;
        if (iVar8 < 1) {
          uVar7 = 0;
        }
        else {
          iVar15 = iVar8 + -1;
          uVar7 = 0;
          do {
            uVar13 = iVar15 + uVar7 >> 1;
            uVar1 = *(ushort *)((long)puVar5 + (ulong)(iVar15 + uVar7 & 0xfffffffe));
            if (uVar1 < uVar11) {
              uVar7 = uVar13 + 1;
            }
            else {
              if (uVar1 <= uVar11) goto LAB_00119fa1;
              iVar15 = uVar13 - 1;
            }
          } while ((int)uVar7 <= iVar15);
        }
        uVar13 = 0xffffffff;
        if ((int)uVar7 < iVar8) {
          uVar13 = uVar7;
        }
LAB_00119fa1:
        it->in_container_index = uVar13;
        val = (uint)*(ushort *)((long)puVar5 + (long)(int)uVar13 * 2) | it->highbits;
      }
      it->current_value = val;
LAB_00119fb1:
      it->has_value = true;
      return true;
    }
  }
  else {
    puVar3 = (prVar2->high_low_container).keys;
    uVar11 = (ushort)(val >> 0x10);
    if (puVar3[(long)iVar8 + -1] == uVar11) goto LAB_00119da1;
    if (0 < iVar8) {
      iVar8 = iVar8 + -1;
      uVar13 = 0;
      do {
        uVar7 = iVar8 + uVar13 >> 1;
        uVar1 = *(ushort *)((long)puVar3 + (ulong)(iVar8 + uVar13 & 0xfffffffe));
        if (uVar1 < uVar11) {
          uVar13 = uVar7 + 1;
        }
        else {
          if (uVar1 <= uVar11) goto LAB_00119dad;
          iVar8 = uVar7 - 1;
        }
      } while ((int)uVar13 <= iVar8);
      uVar7 = ~uVar13;
      goto LAB_00119da3;
    }
    uVar7 = 0xffffffff;
  }
  uVar7 = ~uVar7;
LAB_00119e9d:
  it->container_index = uVar7;
  _Var6 = loadfirstvalue(it);
  it->has_value = _Var6;
  return _Var6;
code_r0x00119e06:
  iVar8 = iVar8 + -0x40;
  if (uVar13 < 2) goto LAB_00119e79;
  goto LAB_00119df7;
}

Assistant:

bool roaring_move_uint32_iterator_equalorlarger(roaring_uint32_iterator_t *it, uint32_t val) {
    uint16_t hb = val >> 16;
    const int i = ra_get_index(& it->parent->high_low_container, hb);
    if (i >= 0) {
      uint32_t lowvalue = container_maximum(it->parent->high_low_container.containers[i], it->parent->high_low_container.typecodes[i]);
      uint16_t lb = val & 0xFFFF;
      if(lowvalue < lb ) {
        it->container_index = i+1; // will have to load first value of next container
      } else {// the value is necessarily within the range of the container
        it->container_index = i;
        it->has_value = loadfirstvalue_largeorequal(it, val);
        return it->has_value;
      }
    } else {
      // there is no matching, so we are going for the next container
      it->container_index = -i-1;
    }
    it->has_value = loadfirstvalue(it);
    return it->has_value;
}